

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateGetRootAsAccessors
          (KotlinGenerator *this,string *struct_name,CodeWriter *writer,IDLOptions *options)

{
  allocator<char> local_119;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"gr_name",(allocator<char> *)&local_f8);
  CodeWriter::SetValue(writer,&local_118,struct_name);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"gr_method",&local_119);
  std::operator+(&local_f8,"getRootAs",struct_name);
  CodeWriter::SetValue(writer,&local_118,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  GenerateJvmStaticAnnotation(writer,options->gen_jvmstatic);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"fun {{gr_method}}(_bb: ByteBuffer): {{gr_name}} = \\",
             (allocator<char> *)&local_118);
  CodeWriter::operator+=(writer,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"{{gr_method}}(_bb, {{gr_name}}())",(allocator<char> *)&local_118);
  CodeWriter::operator+=(writer,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  GenerateJvmStaticAnnotation(writer,options->gen_jvmstatic);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "fun {{gr_method}}(_bb: ByteBuffer, obj: {{gr_name}}): {{gr_name}} {",
             (allocator<char> *)&local_118);
  CodeWriter::operator+=(writer,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"_bb.order(ByteOrder.LITTLE_ENDIAN)",(allocator<char> *)&local_118)
  ;
  CodeWriter::operator+=(writer,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "return (obj.__assign(_bb.getInt(_bb.position()) + _bb.position(), _bb))",
             (allocator<char> *)&local_118);
  CodeWriter::operator+=(writer,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  if (writer->cur_ident_lvl_ != 0) {
    writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"}",(allocator<char> *)&local_118);
  CodeWriter::operator+=(writer,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

void GenerateGetRootAsAccessors(const std::string &struct_name,
                                  CodeWriter &writer,
                                  IDLOptions options) const {
    // Generate a special accessor for the table that when used as the root
    // ex: fun getRootAsMonster(_bb: ByteBuffer): Monster {...}
    writer.SetValue("gr_name", struct_name);
    writer.SetValue("gr_method", "getRootAs" + struct_name);

    // create convenience method that doesn't require an existing object
    GenerateJvmStaticAnnotation(writer, options.gen_jvmstatic);
    writer += "fun {{gr_method}}(_bb: ByteBuffer): {{gr_name}} = \\";
    writer += "{{gr_method}}(_bb, {{gr_name}}())";

    // create method that allows object reuse
    // ex: fun Monster getRootAsMonster(_bb: ByteBuffer, obj: Monster) {...}
    GenerateJvmStaticAnnotation(writer, options.gen_jvmstatic);
    writer +=
        "fun {{gr_method}}"
        "(_bb: ByteBuffer, obj: {{gr_name}}): {{gr_name}} {";
    writer.IncrementIdentLevel();
    writer += "_bb.order(ByteOrder.LITTLE_ENDIAN)";
    writer +=
        "return (obj.__assign(_bb.getInt(_bb.position())"
        " + _bb.position(), _bb))";
    writer.DecrementIdentLevel();
    writer += "}";
  }